

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmCommonTargetGenerator::AddFortranFlags(cmCommonTargetGenerator *this,string *flags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  cmGeneratorTarget *target;
  cmLocalCommonGenerator *this_00;
  size_type sVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  pointer source;
  string modflag;
  string flg;
  string mod_dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string local_d0;
  string local_b0;
  string local_90;
  string *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  pcVar2 = this->Makefile;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_70 = flags;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"CMAKE_Fortran_MODOUT_FLAG","");
  pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (pcVar4 != (char *)0x0) {
    (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])
              (this->LocalGenerator,local_70,pcVar4);
  }
  GetFortranModuleDirectory_abi_cxx11_(&local_90,this);
  if ((char *)local_90._M_string_length == (char *)0x0) {
    pcVar2 = this->Makefile;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"CMAKE_Fortran_MODDIR_DEFAULT","");
    pcVar4 = cmMakefile::GetSafeDefinition(pcVar2,&local_d0);
    sVar3 = local_90._M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)sVar3,(ulong)pcVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == &local_d0.field_2) goto LAB_002ee62e;
  }
  else {
    cmOutputConverter::Convert
              (&local_d0,&(this->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter,
               &local_90,this->WorkingDirectory,SHELL);
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == &local_d0.field_2) goto LAB_002ee62e;
  }
  operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
LAB_002ee62e:
  if ((char *)local_90._M_string_length != (char *)0x0) {
    pcVar2 = this->Makefile;
    paVar1 = &local_d0.field_2;
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"CMAKE_Fortran_MODDIR_FLAG","");
    pcVar4 = cmMakefile::GetRequiredDefinition(pcVar2,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string((string *)&local_d0,pcVar4,(allocator *)&local_b0);
    std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_90._M_dataplus._M_p);
    (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[5])
              (this->LocalGenerator,local_70,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar2 = this->Makefile;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"CMAKE_Fortran_MODPATH_FLAG","");
  pcVar4 = cmMakefile::GetDefinition(pcVar2,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (pcVar4 != (char *)0x0) {
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar2 = this->Makefile;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"CMAKE_BUILD_TYPE","");
    pcVar5 = cmMakefile::GetSafeDefinition(pcVar2,&local_b0);
    std::__cxx11::string::string((string *)&local_d0,pcVar5,(allocator *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    target = this->GeneratorTarget;
    this_00 = this->LocalGenerator;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"C","");
    cmLocalGenerator::GetIncludeDirectories
              (&this_00->super_cmLocalGenerator,&local_68,target,&local_b0,&local_d0,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_68.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      source = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        sVar6 = strlen(pcVar4);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,pcVar4,pcVar4 + sVar6);
        cmOutputConverter::Convert
                  (&local_50,&(this->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter
                   ,source,NONE,SHELL);
        std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[5])
                  (this->LocalGenerator,local_70,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        source = source + 1;
      } while (source != local_68.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCommonTargetGenerator::AddFortranFlags(std::string& flags)
{
  // Enable module output if necessary.
  if(const char* modout_flag =
     this->Makefile->GetDefinition("CMAKE_Fortran_MODOUT_FLAG"))
    {
    this->LocalGenerator->AppendFlags(flags, modout_flag);
    }

  // Add a module output directory flag if necessary.
  std::string mod_dir = this->GetFortranModuleDirectory();
  if (!mod_dir.empty())
    {
    mod_dir = this->Convert(mod_dir,
                            this->WorkingDirectory,
                            cmLocalGenerator::SHELL);
    }
  else
    {
    mod_dir =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_MODDIR_DEFAULT");
    }
  if (!mod_dir.empty())
    {
    const char* moddir_flag =
      this->Makefile->GetRequiredDefinition("CMAKE_Fortran_MODDIR_FLAG");
    std::string modflag = moddir_flag;
    modflag += mod_dir;
    this->LocalGenerator->AppendFlags(flags, modflag);
    }

  // If there is a separate module path flag then duplicate the
  // include path with it.  This compiler does not search the include
  // path for modules.
  if(const char* modpath_flag =
     this->Makefile->GetDefinition("CMAKE_Fortran_MODPATH_FLAG"))
    {
    std::vector<std::string> includes;
    const std::string& config =
      this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
    this->LocalGenerator->GetIncludeDirectories(includes,
                                                this->GeneratorTarget,
                                                "C", config);
    for(std::vector<std::string>::const_iterator idi = includes.begin();
        idi != includes.end(); ++idi)
      {
      std::string flg = modpath_flag;
      flg += this->Convert(*idi,
                           cmLocalGenerator::NONE,
                           cmLocalGenerator::SHELL);
      this->LocalGenerator->AppendFlags(flags, flg);
      }
    }
}